

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O0

void log_reconfig(LogContext *ctx,Conf *conf)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  Filename *f1;
  Filename *f2;
  Conf *pCVar5;
  _Bool reset_logging;
  Conf *conf_local;
  LogContext *ctx_local;
  
  f1 = conf_get_filename(ctx->conf,0x81);
  f2 = conf_get_filename(conf,0x81);
  _Var2 = filename_equal(f1,f2);
  if (_Var2) {
    iVar4 = conf_get_int(ctx->conf,0x82);
    iVar3 = conf_get_int(conf,0x82);
    if (iVar4 == iVar3) {
      bVar1 = false;
      goto LAB_0010bb4c;
    }
  }
  bVar1 = true;
LAB_0010bb4c:
  if (bVar1) {
    logfclose(ctx);
  }
  conf_free(ctx->conf);
  pCVar5 = conf_copy(conf);
  ctx->conf = pCVar5;
  iVar4 = conf_get_int(ctx->conf,0x82);
  ctx->logtype = iVar4;
  if (bVar1) {
    logfopen(ctx);
  }
  return;
}

Assistant:

void log_reconfig(LogContext *ctx, Conf *conf)
{
    bool reset_logging;

    if (!filename_equal(conf_get_filename(ctx->conf, CONF_logfilename),
                        conf_get_filename(conf, CONF_logfilename)) ||
        conf_get_int(ctx->conf, CONF_logtype) !=
        conf_get_int(conf, CONF_logtype))
        reset_logging = true;
    else
        reset_logging = false;

    if (reset_logging)
        logfclose(ctx);

    conf_free(ctx->conf);
    ctx->conf = conf_copy(conf);

    ctx->logtype = conf_get_int(ctx->conf, CONF_logtype);

    if (reset_logging)
        logfopen(ctx);
}